

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDEdgePtr eptr,double edge_s,
          ON_SubDFace *active_face)

{
  bool bVar1;
  uint i;
  ON_SubDEdge *this_00;
  ON_SubDFacePtr fptr;
  ON_SubDEdgePtr local_40;
  double local_38;
  anon_union_8_3_7b68a318_for_m_p1 local_28;
  ON_SubDComponentId local_20;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  local_40.m_ptr = eptr.m_ptr;
  local_38 = edge_s;
  ON_SubDComponentId::ON_SubDComponentId(&local_20,eptr);
  bVar1 = Internal_Init(this,local_20);
  if (bVar1) {
    this_00 = ON_SubDEdgePtr::Edge(&local_40);
    if (this_00 != (ON_SubDEdge *)0x0) {
      this->m_p0 = (anon_union_8_3_6bf0bb0e_for_m_p0)
                   (~-(ulong)(0.0 <= local_38) & (ulong)ON_DBL_QNAN |
                   (~-(ulong)(local_38 <= 1.0) & (ulong)ON_DBL_QNAN |
                   -(ulong)(local_38 <= 1.0) & (ulong)local_38) & -(ulong)(0.0 <= local_38));
      if (active_face != (ON_SubDFace *)0x0) {
        i = ON_SubDEdge::FaceArrayIndex(this_00,active_face);
        fptr = ON_SubDEdge::FacePtr(this_00,i);
        ON_SubDComponentId::ON_SubDComponentId(&local_28.v_active_f,fptr);
        this->m_p1 = local_28;
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDEdgePtr eptr,
  double edge_s,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(eptr)))
  {
    const ON_SubDEdge* e = eptr.Edge();
    if (nullptr != e)
    {
      m_p0.eptr_s = (edge_s >= 0.0 && edge_s <= 1.0) ? edge_s : ON_DBL_QNAN;
      if (nullptr != active_face)
      {
        const unsigned efi = e->FaceArrayIndex(active_face);
        m_p1.e_active_f = e->FacePtr(efi);
      }
    }
  }
}